

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt_solver_basis.cc
# Opt level: O2

void __thiscall ipx::KKTSolverBasis::DropPrimal(KKTSolverBasis *this,Iterate *iterate,Info *info)

{
  ipxint *piVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  Basis *pBVar6;
  double *pdVar7;
  uint uVar8;
  pointer piVar9;
  bool bVar10;
  BasicStatus BVar11;
  Int IVar12;
  Int IVar13;
  long lVar14;
  ostream *poVar15;
  Int ii;
  ulong uVar16;
  ipx *this_00;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  Int jmax;
  double local_150;
  Iterate *local_148;
  Vector invscale_basic;
  vector<int,_std::allocator<int>_> candidates;
  Int jb;
  undefined4 uStack_f4;
  double *local_f0;
  double *local_e8;
  Int *local_e0;
  double vmax;
  double s;
  IndexedVector row;
  bool exchanged;
  IndexedVector btran;
  
  uVar4 = this->model_->num_rows_;
  iVar5 = this->model_->num_cols_;
  local_148 = iterate;
  IndexedVector::IndexedVector(&btran,uVar4);
  IndexedVector::IndexedVector(&row,iVar5 + uVar4);
  local_150 = (this->control_->parameters_).super_ipx_parameters.ipm_drop_primal;
  (info->super_ipx_info).errflag = 0;
  candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  uVar16 = 0;
  uVar8 = uVar4;
  if ((int)uVar4 < 1) {
    uVar8 = 0;
  }
  for (; uVar8 != uVar16; uVar16 = uVar16 + 1) {
    IVar13 = (this->basis_->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar16];
    _jb = (KKTSolverBasis *)CONCAT44(uStack_f4,IVar13);
    BVar11 = Basis::StatusOf(this->basis_,IVar13);
    if (BVar11 == BASIC) {
      lVar14 = (long)jb;
      dVar2 = (local_148->xl_)._M_data[lVar14];
      dVar19 = (local_148->xu_)._M_data[lVar14];
      dVar3 = dVar19;
      if (dVar19 >= dVar2) {
        dVar3 = dVar2;
      }
      if ((dVar3 <= local_150) && (dVar3 < (&local_148->zl_)[dVar19 < dVar2]._M_data[lVar14] * 0.01)
         ) {
        std::vector<int,_std::allocator<int>_>::push_back(&candidates,&jb);
      }
    }
  }
  if (candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    std::valarray<double>::valarray(&invscale_basic,(long)(int)uVar4);
    pBVar6 = this->basis_;
    pdVar7 = (this->colscale_)._M_data;
    for (uVar16 = 0; uVar8 != uVar16; uVar16 = uVar16 + 1) {
      invscale_basic._M_data[uVar16] =
           1.0 / pdVar7[(pBVar6->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16]];
    }
LAB_003803da:
    if (candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      IVar13 = candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
      IVar12 = Basis::PositionOf(this->basis_,IVar13);
      local_150 = (double)(long)IVar12;
      s = invscale_basic._M_data[(long)local_150];
      Basis::TableauRow(this->basis_,IVar13,&btran,&row,true);
      jmax = -1;
      vmax = 2.0;
      local_f0 = &s;
      local_e8 = &vmax;
      local_e0 = &jmax;
      _jb = this;
      bVar10 = IndexedVector::sparse(&row);
      piVar9 = row.pattern_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar10) {
        uVar4 = row.nnz_;
        if (row.nnz_ < 1) {
          uVar4 = 0;
        }
        for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
          DropPrimal::anon_class_32_4_ca84b024::operator()
                    ((anon_class_32_4_ca84b024 *)&jb,piVar9[uVar16],
                     row.elements_._M_data[piVar9[uVar16]]);
        }
      }
      else {
        uVar4 = (uint)row.elements_._M_size;
        if ((int)(uint)row.elements_._M_size < 1) {
          uVar4 = 0;
        }
        for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
          DropPrimal::anon_class_32_4_ca84b024::operator()
                    ((anon_class_32_4_ca84b024 *)&jb,(Int)uVar16,row.elements_._M_data[uVar16]);
        }
      }
      if ((long)jmax < 0) {
        auVar17._8_8_ = (local_148->zu_)._M_data[IVar13];
        auVar17._0_8_ = (local_148->zl_)._M_data[IVar13];
        auVar18._8_8_ = (local_148->xu_)._M_data[IVar13];
        auVar18._0_8_ = (local_148->xl_)._M_data[IVar13];
        auVar18 = divpd(auVar17,auVar18);
        if (auVar18._0_8_ <= auVar18._8_8_) {
          Iterate::make_implied_ub(local_148,IVar13);
        }
        else {
          Iterate::make_implied_lb(local_148,IVar13);
        }
        Basis::FreeBasicVariable(this->basis_,IVar13);
        invscale_basic._M_data[(long)local_150] = 0.0;
        (this->colscale_)._M_data[IVar13] = INFINITY;
        piVar1 = &(info->super_ipx_info).primal_dropped;
        *piVar1 = *piVar1 + 1;
        goto LAB_003806a3;
      }
      dVar2 = row.elements_._M_data[jmax];
      dVar19 = ABS(dVar2);
      if (dVar19 < 0.001) {
        poVar15 = Control::Debug(this->control_,3);
        this_00 = (ipx *)0x3b6778;
        poVar15 = std::operator<<(poVar15," |pivot| = ");
        sci2_abi_cxx11_((string *)&exchanged,this_00,dVar19);
        poVar15 = std::operator<<(poVar15,(string *)&exchanged);
        std::operator<<(poVar15," (primal basic variable close to bound)\n");
        std::__cxx11::string::~string((string *)&exchanged);
      }
      IVar13 = Basis::ExchangeIfStable(this->basis_,IVar13,jmax,dVar2,1,&exchanged);
      (info->super_ipx_info).errflag = IVar13;
      if (IVar13 == 0) goto code_r0x003805cc;
    }
    operator_delete(invscale_basic._M_data);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&candidates.super__Vector_base<int,_std::allocator<int>_>);
  IndexedVector::~IndexedVector(&row);
  IndexedVector::~IndexedVector(&btran);
  return;
code_r0x003805cc:
  if (exchanged == true) {
    invscale_basic._M_data[(long)local_150] = 1.0 / (this->colscale_)._M_data[jmax];
    piVar1 = &(info->super_ipx_info).updates_ipm;
    *piVar1 = *piVar1 + 1;
    this->basis_changes_ = this->basis_changes_ + 1;
LAB_003806a3:
    candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
  }
  goto LAB_003803da;
}

Assistant:

void KKTSolverBasis::DropPrimal(Iterate* iterate, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& xl = iterate->xl();
    const Vector& xu = iterate->xu();
    const Vector& zl = iterate->zl();
    const Vector& zu = iterate->zu();
    IndexedVector btran(m), row(n+m);
    const double drop_primal = control_.ipm_drop_primal();
    const double volume_tol = 2.0;
    info->errflag = 0;

    std::vector<Int> candidates;
    for (Int p = 0; p < m; p++) {
        Int jb = basis_[p];
        if (basis_.StatusOf(jb) != Basis::BASIC) // ignore free variables
            continue;
        assert(std::isfinite(xl[jb]) || std::isfinite(xu[jb]));
        assert(xl[jb] > 0.0);
        assert(xu[jb] > 0.0);
        double xj, zj;          // choose which bound is nearer
        if (xl[jb] <= xu[jb]) {
            xj = xl[jb];
            zj = zl[jb];
        } else {
            xj = xu[jb];
            zj = zu[jb];
        }
        if (xj < 0.01*zj && xj <= drop_primal)
            candidates.push_back(jb);
    }
    if (candidates.empty())
        return;

    // Maintain a copy of the inverse scaling factors of basic variables for
    // faster access.
    Vector invscale_basic(m);
    for (Int p = 0; p < m; p++) {
        Int j = basis_[p];
        invscale_basic[p] = 1.0 / colscale_[j];
        assert(std::isfinite(invscale_basic[p]));
        assert(invscale_basic[p] >= 0.0);
    }

    while (!candidates.empty()) {
        Int jb = candidates.back();
        Int p = basis_.PositionOf(jb);
        assert(p >= 0);
        // Pivot jb out of the basis if the volume increase sufficiently.
        const double s = invscale_basic[p];
        basis_.TableauRow(jb, btran, row, true);
        Int jmax = -1;
        double vmax = volume_tol;
        auto search_pivot = [&](Int j, double pivot) {
            pivot = std::abs(pivot);
            if (pivot > kPivotZeroTol) {
                double v = pivot * colscale_[j] * s;
                if (v > vmax) {
                    vmax = v;
                    jmax = j;
                }
            }
        };
        for_each_nonzero(row, search_pivot);
        if (jmax >= 0) {
            // Pivot jb out of the basis.
            double pivot = row[jmax];
            if (std::abs(pivot) < 1e-3)
                control_.Debug(3)
                    << " |pivot| = " << sci2(std::abs(pivot))
                    << " (primal basic variable close to bound)\n";
            assert(basis_.StatusOf(jmax) == Basis::NONBASIC);
            bool exchanged;
            info->errflag = basis_.ExchangeIfStable(jb, jmax, pivot, 1,
                                                    &exchanged);
            if (info->errflag)
                return;
            if (!exchanged)     // factorization was unstable, try again
                continue;
            invscale_basic[p] = 1.0 / colscale_[jmax];
            assert(std::isfinite(invscale_basic[p]));
            assert(invscale_basic[p] >= 0.0);
            info->updates_ipm++;
            basis_changes_++;
        } else {
            // Make variable jb "implied" at a bound.
            if (zl[jb]/xl[jb] > zu[jb]/xu[jb])
                iterate->make_implied_lb(jb);
            else
                iterate->make_implied_ub(jb);
            basis_.FreeBasicVariable(jb);
            invscale_basic[p] = 0.0;
            colscale_[jb] = INFINITY;
            info->primal_dropped++;
        }
        candidates.pop_back();
    }
}